

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

bool DivisionNegativeCornerCaseHelper<short,_unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::NegativeCornerCase
               (unsigned_long_long lhs,
               SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  short sVar3;
  ulong uVar4;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)~rhs.m_int + 1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = lhs;
  uVar4 = SUB168(auVar2 / auVar1,0);
  if (uVar4 < 0x8000) {
    sVar3 = -SUB162(auVar2 / auVar1,0);
  }
  else {
    sVar3 = -0x8000;
    if (uVar4 != 0x8000) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
  }
  result->m_int = sVar3;
  return true;
}

Assistant:

SAFE_INT_NODISCARD static bool NegativeCornerCase( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        // Problem case - normal casting behavior changes meaning
        // flip rhs to positive
        // any operator casts now do the right thing
        U tmp = division_negative_negateU< T, U, sizeof(T) == 4>::div(rhs, lhs);

        if( tmp <= (U)std::numeric_limits<T>::max() )
        {
            result = SafeInt< T, E >( (T)(~(std::uint64_t)tmp + 1) );
            return true;
        }

        // Corner case
        T maxT = std::numeric_limits<T>::max();
        if( tmp == (U)maxT + 1 )
        {
            T minT = std::numeric_limits<T>::min();
            result = SafeInt< T, E >( minT );
            return true;
        }

        E::SafeIntOnOverflow();
    }